

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependencyKeyIDs.h
# Opt level: O1

void __thiscall
llbuild::core::DependencyKeyIDs::push_back
          (DependencyKeyIDs *this,KeyID id,bool orderOnlyFlag,bool singleUseFlag)

{
  pointer *ppuVar1;
  iterator __position;
  iterator __position_00;
  byte local_21;
  KeyID local_20;
  
  __position._M_current =
       (this->keys).super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_20._value = id._value;
  if (__position._M_current ==
      (this->keys).super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>>::
    _M_realloc_insert<llbuild::core::KeyID_const&>
              ((vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>> *)this,__position,
               &local_20);
  }
  else {
    (__position._M_current)->_value = id._value;
    (this->keys).super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_21 = singleUseFlag * '\x02' | orderOnlyFlag;
  __position_00._M_current =
       (this->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->flags,__position_00,&local_21);
  }
  else {
    *__position_00._M_current = local_21;
    ppuVar1 = &(this->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return;
}

Assistant:

void push_back(KeyID id, bool orderOnlyFlag, bool singleUseFlag) {
    keys.push_back(id);
    flags.push_back((singleUseFlag << 1) | orderOnlyFlag);
  }